

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_resume_data_checked(torrent *this,status_t status,storage_error *error)

{
  storage_error *args_1;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference adr;
  torrent_peer *adr_00;
  pointer ppVar8;
  type atp;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar9;
  undefined8 uVar10;
  element_type *this_00;
  pointer paVar11;
  torrent_info *ptVar12;
  int *piVar13;
  pointer ppVar14;
  bool local_366;
  bool local_2a9;
  uint local_290;
  piece_block local_23c;
  int local_234;
  int local_230;
  int k;
  int local_228;
  int num_bits;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_220;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_21c;
  bitfield *local_218;
  bitfield *blocks;
  reference ppStack_208;
  piece_index_t piece;
  pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>
  *p_2;
  iterator __end5;
  iterator __begin5;
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>_>
  *__range5;
  int num_blocks_per_piece;
  int local_1dc;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1d8;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1d4;
  int local_1d0;
  piece_index_t i_1;
  int num_pieces;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1bc;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1b8;
  int local_1b4;
  piece_index_t i;
  int num_pieces2;
  undefined1 local_1a0 [7];
  bool should_start_full_check;
  int local_180;
  int local_17c;
  string local_178;
  undefined1 local_158 [22];
  bitfield_flag local_142;
  undefined1 local_141;
  uchar local_140;
  bitfield_flag local_13f;
  undefined1 local_13e;
  uchar local_13d;
  bitfield_flag local_13c;
  bool local_13b;
  pex_flags_t local_13a;
  peer_source_flags_t local_139;
  bool has_error_status;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_138;
  torrent_peer *peer_1;
  basic_endpoint<boost::asio::ip::tcp> *p_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range3_1;
  string local_f0;
  reference local_d0;
  basic_endpoint<boost::asio::ip::tcp> *peer;
  iterator __end4;
  iterator __begin4;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range4;
  string str;
  basic_endpoint<boost::asio::ip::tcp> *p;
  iterator __end3;
  iterator __begin3;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range3;
  string_view local_60;
  undefined1 local_4b;
  uchar local_4a;
  bitfield_flag local_49;
  undefined1 local_48 [38];
  bitfield_flag local_22;
  uchar local_21;
  storage_error *psStack_20;
  resume_data_flags_t need_save_resume_data;
  storage_error *error_local;
  torrent *this_local;
  status_t status_local;
  
  local_21 = (this->m_need_save_resume_data).m_val;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) != 0) {
    return;
  }
  local_48[0x24] = 8;
  local_48[0x25] = status.m_val;
  psStack_20 = error;
  this_local._7_1_ = status.m_val;
  local_22 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                        status.m_val,
                        (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)0x8
                       );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_22);
  if (bVar1) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar1 = alert_manager::should_post<libtorrent::oversized_file_alert>
                      ((alert_manager *)CONCAT44(extraout_var,iVar5));
    if (bVar1) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_48);
      alert_manager::emplace_alert<libtorrent::oversized_file_alert,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar5),(torrent_handle *)local_48);
      torrent_handle::~torrent_handle((torrent_handle *)local_48);
    }
  }
  local_4a = this_local._7_1_;
  local_4b = 1;
  local_49 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                        this_local._7_1_,
                        (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)0x1
                       );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_49);
  if (bVar1) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"check_resume_data");
    handle_disk_error(this,local_60,psStack_20,(peer_connection *)0x0,none);
    auto_managed(this,false);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
    bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)
                  ((long)&__range3 + 7));
    pause(this);
  }
  state_updated(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params);
  if (!bVar1) goto LAB_006729c0;
  paVar11 = ::std::
            unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
            ::operator->(&this->m_add_torrent_params);
  __end3 = ::std::
           vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ::begin(&paVar11->peers);
  p = (basic_endpoint<boost::asio::ip::tcp> *)
      ::std::
      vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ::end(&paVar11->peers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                                     *)&p), bVar1) {
    adr = __gnu_cxx::
          __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
          ::operator*(&__end3);
    str.field_2._M_local_buf[0xf] = '\x10';
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::bitfield_flag
              ((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> *)
               (str.field_2._M_local_buf + 0xe));
    add_peer(this,adr,(peer_source_flags_t)str.field_2._M_local_buf[0xf],
             (pex_flags_t)str.field_2._M_local_buf[0xe]);
    __gnu_cxx::
    __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
    ::operator++(&__end3);
  }
  uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar3 & 1) != 0) {
    paVar11 = ::std::
              unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ::operator->(&this->m_add_torrent_params);
    bVar1 = ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ::empty(&paVar11->peers);
    if (!bVar1) {
      ::std::__cxx11::string::string((string *)&__range4);
      paVar11 = ::std::
                unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                ::operator->(&this->m_add_torrent_params);
      __end4 = ::std::
               vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ::begin(&paVar11->peers);
      peer = (basic_endpoint<boost::asio::ip::tcp> *)
             ::std::
             vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ::end(&paVar11->peers);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                                         *)&peer), bVar1) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                   ::operator*(&__end4);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  ((address *)&__range3_1,local_d0);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_f0,(address *)&__range3_1);
        ::std::__cxx11::string::operator+=((string *)&__range4,(string *)&local_f0);
        ::std::__cxx11::string::~string((string *)&local_f0);
        ::std::__cxx11::string::operator+=((string *)&__range4,' ');
        __gnu_cxx::
        __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
        ::operator++(&__end4);
      }
      uVar10 = ::std::__cxx11::string::c_str();
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
      if (bVar1) {
        ppVar8 = ::std::
                 unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ::operator->(&(this->super_torrent_hot_members).m_peer_list);
        local_290 = peer_list::num_connect_candidates(ppVar8);
      }
      else {
        local_290 = 0xffffffff;
      }
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"resume-checked add_peer() [ %s] connect-candidates: %d",uVar10,
                 (ulong)local_290);
      ::std::__cxx11::string::~string((string *)&__range4);
    }
  }
  paVar11 = ::std::
            unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
            ::operator->(&this->m_add_torrent_params);
  __end3_1 = ::std::
             vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ::begin(&paVar11->banned_peers);
  p_1 = (basic_endpoint<boost::asio::ip::tcp> *)
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::end(&paVar11->banned_peers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                             *)&p_1), bVar1) {
    adr_00 = (torrent_peer *)
             __gnu_cxx::
             __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
             ::operator*(&__end3_1);
    local_139.m_val = '\x10';
    peer_1 = adr_00;
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::bitfield_flag
              (&local_13a);
    _Stack_138._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         add_peer(this,(endpoint *)adr_00,local_139,local_13a);
    if ((torrent_peer *)_Stack_138._M_pi != (torrent_peer *)0x0) {
      ban_peer(this,(torrent_peer *)_Stack_138._M_pi);
    }
    __gnu_cxx::
    __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
    ::operator++(&__end3_1);
  }
  paVar11 = ::std::
            unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
            ::operator->(&this->m_add_torrent_params);
  bVar1 = ::std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ::empty(&paVar11->peers);
  if (bVar1) {
    paVar11 = ::std::
              unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ::operator->(&this->m_add_torrent_params);
    bVar1 = ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ::empty(&paVar11->banned_peers);
    if (!bVar1) goto LAB_0067292d;
  }
  else {
LAB_0067292d:
    update_want_peers(this);
  }
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar1) {
    ppVar8 = ::std::
             unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    iVar5 = peer_list::num_peers(ppVar8);
    if (0 < iVar5) {
      ppVar8 = ::std::
               unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
               ::operator->(&(this->super_torrent_hot_members).m_peer_list);
      uVar3 = peer_list::num_peers(ppVar8);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"resume added peers (total peers: %d)",(ulong)uVar3);
    }
  }
LAB_006729c0:
  local_13d = this_local._7_1_;
  local_13e = 1;
  local_13c = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                         this_local._7_1_,
                         (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                         0x1);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_13c);
  local_2a9 = true;
  if (!bVar1) {
    local_140 = this_local._7_1_;
    local_141 = 2;
    local_13f = (bitfield_flag)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                           this_local._7_1_,
                           (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>)
                           0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_13f);
    local_2a9 = true;
    if (!bVar1) {
      local_158[0x15] = this_local._7_1_;
      local_158[0x14] = 4;
      local_142 = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                              )this_local._7_1_,
                             (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                              )0x4);
      local_2a9 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_142);
    }
  }
  local_13b = local_2a9;
  bVar1 = storage_error::operator_cast_to_bool(psStack_20);
  if (((bVar1) || ((local_13b & 1U) != 0)) &&
     (bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params),
     bVar1)) {
    atp = ::std::
          unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
          ::operator*(&this->m_add_torrent_params);
    bVar1 = contains_resume_data(atp);
    if (bVar1) {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      bVar1 = alert_manager::should_post<libtorrent::fastresume_rejected_alert>
                        ((alert_manager *)CONCAT44(extraout_var_01,iVar5));
      if (bVar1) {
        iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_158);
        args_1 = psStack_20;
        local_17c = (int)storage_error::file(psStack_20);
        resolve_filename_abi_cxx11_(&local_178,this,(file_index_t)local_17c);
        alert_manager::
        emplace_alert<libtorrent::fastresume_rejected_alert,libtorrent::torrent_handle,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&>
                  ((alert_manager *)CONCAT44(extraout_var_02,iVar5),(torrent_handle *)local_158,
                   &args_1->ec,&local_178,&psStack_20->operation);
        ::std::__cxx11::string::~string((string *)&local_178);
        torrent_handle::~torrent_handle((torrent_handle *)local_158);
      }
    }
  }
  uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar3 & 1) != 0) {
    if (((local_13b & 1U) != 0) || (bVar1 = storage_error::operator_cast_to_bool(psStack_20), bVar1)
       ) {
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_unsigned_char
                        ((bitfield_flag *)((long)&this_local + 7));
      uVar3 = boost::system::error_code::value(&psStack_20->ec);
      pcVar9 = operation_name(psStack_20->operation);
      local_180 = (int)storage_error::file(psStack_20);
      uVar4 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_180);
      boost::system::error_code::message_abi_cxx11_((string *)local_1a0,&psStack_20->ec);
      uVar10 = ::std::__cxx11::string::c_str();
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"fastresume data rejected: ret: %d (%d) op: %s file: %d %s",(ulong)bVar2,
                 (ulong)uVar3,pcVar9,(ulong)uVar4,uVar10);
      ::std::__cxx11::string::~string((string *)local_1a0);
    }
    else {
      (*(this->super_request_callback)._vptr_request_callback[7])(this,"fastresume data accepted");
    }
  }
  num_pieces2._3_1_ = local_13b & 1;
  if (((local_13b & 1U) == 0) &&
     (bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params),
     bVar1)) {
    paVar11 = ::std::
              unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ::operator->(&this->m_add_torrent_params);
    bVar1 = bitfield::empty(&(paVar11->have_pieces).super_bitfield);
    if (!bVar1) {
      paVar11 = ::std::
                unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                ::operator->(&this->m_add_torrent_params);
      iVar5 = bitfield::size(&(paVar11->have_pieces).super_bitfield);
      this_00 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      iVar6 = torrent_info::num_pieces(this_00);
      if (iVar5 < iVar6) {
        paVar11 = ::std::
                  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                  ::operator->(&this->m_add_torrent_params);
        sVar7 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                ::end_index(&paVar11->have_pieces);
        (this->m_num_checked_pieces).m_val = sVar7.m_val;
        (this->m_checking_piece).m_val = (this->m_num_checked_pieces).m_val;
        num_pieces2._3_1_ = 1;
      }
    }
  }
  if ((local_13b & 1U) == 0) {
    if (((byte)this->field_0x5cc >> 2 & 1) == 0) {
      bVar1 = storage_error::operator_cast_to_bool(psStack_20);
      if ((!bVar1) &&
         (bVar1 = ::std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&this->m_add_torrent_params), bVar1)) {
        paVar11 = ::std::
                  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                  ::operator->(&this->m_add_torrent_params);
        i_1.m_val = bitfield::size(&(paVar11->have_pieces).super_bitfield);
        ptVar12 = torrent_file(this);
        local_1d0 = torrent_info::num_pieces(ptVar12);
        piVar13 = ::std::min<int>(&i_1.m_val,&local_1d0);
        iVar5 = *piVar13;
        memset(&local_1d4,0,4);
        while( true ) {
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                    (&local_1d8,iVar5);
          bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                            (&local_1d4,&local_1d8);
          if (!bVar1) break;
          paVar11 = ::std::
                    unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                    ::operator->(&this->m_add_torrent_params);
          local_1dc = local_1d4.m_val;
          bVar1 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  ::operator[](&paVar11->have_pieces,local_1d4);
          if (bVar1) {
            need_picker(this);
            ppVar14 = ::std::
                      unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                      ::operator->(&(this->super_torrent_hot_members).m_picker);
            num_blocks_per_piece = local_1d4.m_val;
            piece_picker::we_have(ppVar14,(piece_index_t)local_1d4.m_val);
            inc_stats_counter(this,0x6b,1);
            update_gauge(this);
            __range5._4_4_ = local_1d4.m_val;
            we_have(this,(piece_index_t)local_1d4.m_val,true);
          }
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++(&local_1d4);
        }
        ptVar12 = torrent_file(this);
        __range5._0_4_ = torrent_info::blocks_per_piece(ptVar12);
        paVar11 = ::std::
                  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                  ::operator->(&this->m_add_torrent_params);
        __end5 = ::std::
                 map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                 ::begin(&(paVar11->unfinished_pieces).
                          super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                        );
        p_2 = (pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>
               *)::std::
                 map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                 ::end(&(paVar11->unfinished_pieces).
                        super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                      );
        while (bVar1 = ::std::operator!=(&__end5,(_Self *)&p_2), bVar1) {
          ppStack_208 = ::std::
                        _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>
                        ::operator*(&__end5);
          blocks._4_4_ = (ppStack_208->first).m_val;
          local_218 = &ppStack_208->second;
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_21c,0);
          bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                            ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                             ((long)&blocks + 4),&local_21c);
          local_366 = true;
          if (!bVar1) {
            ptVar12 = torrent_file(this);
            local_220.m_val = (int)torrent_info::end_piece(ptVar12);
            local_366 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                                  ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                   ((long)&blocks + 4),&local_220);
          }
          if (local_366 == false) {
            if (((byte)this->field_0x5cc >> 2 & 1) != 0) {
              leave_seed_mode(this,skip_checking);
            }
            bVar1 = has_picker(this);
            if (bVar1) {
              ppVar14 = ::std::
                        unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                        ::operator->(&(this->super_torrent_hot_members).m_picker);
              num_bits = blocks._4_4_;
              bVar1 = piece_picker::have_piece(ppVar14,blocks._4_4_);
              if (bVar1) {
                ppVar14 = ::std::
                          unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ::operator->(&(this->super_torrent_hot_members).m_picker);
                local_228 = blocks._4_4_;
                piece_picker::we_dont_have(ppVar14,blocks._4_4_);
                update_gauge(this);
              }
            }
            need_picker(this);
            local_230 = bitfield::size(local_218);
            piVar13 = ::std::min<int>((int *)&__range5,&local_230);
            k = *piVar13;
            for (local_234 = 0; local_234 < k; local_234 = local_234 + 1) {
              bVar1 = bitfield::get_bit(local_218,local_234);
              if (bVar1) {
                ppVar14 = ::std::
                          unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ::operator->(&(this->super_torrent_hot_members).m_picker);
                piece_block::piece_block(&local_23c,blocks._4_4_,local_234);
                piece_picker::mark_as_finished(ppVar14,local_23c,(torrent_peer *)0x0);
              }
            }
            ppVar14 = ::std::
                      unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                      ::operator->(&(this->super_torrent_hot_members).m_picker);
            bVar1 = piece_picker::is_piece_finished(ppVar14,blocks._4_4_);
            if (bVar1) {
              verify_piece(this,blocks._4_4_);
            }
          }
          ::std::
          _Rb_tree_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>
          ::operator++(&__end5);
        }
      }
    }
    else {
      (this->super_torrent_hot_members).field_0x4b =
           (this->super_torrent_hot_members).field_0x4b | 0x40;
      update_gauge(this);
      update_state_list(this);
      bVar1 = storage_error::operator_cast_to_bool(psStack_20);
      if ((!bVar1) &&
         (bVar1 = ::std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&this->m_add_torrent_params), bVar1)) {
        paVar11 = ::std::
                  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                  ::operator->(&this->m_add_torrent_params);
        i.m_val = bitfield::size(&(paVar11->verified_pieces).super_bitfield);
        ptVar12 = torrent_file(this);
        local_1b4 = torrent_info::num_pieces(ptVar12);
        piVar13 = ::std::min<int>(&i.m_val,&local_1b4);
        iVar5 = *piVar13;
        memset(&local_1b8,0,4);
        while( true ) {
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                    (&local_1bc,iVar5);
          bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                            (&local_1b8,&local_1bc);
          if (!bVar1) break;
          paVar11 = ::std::
                    unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                    ::operator->(&this->m_add_torrent_params);
          bVar1 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  ::operator[](&paVar11->verified_pieces,local_1b8);
          if (bVar1) {
            typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            ::set_bit(&this->m_verified,local_1b8);
          }
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++(&local_1b8);
        }
      }
    }
  }
  else {
    this->field_0x5cc = this->field_0x5cc & 0xfb;
    (this->super_torrent_hot_members).field_0x4b =
         (this->super_torrent_hot_members).field_0x4b & 0xbf;
    update_gauge(this);
    update_state_list(this);
  }
  if (num_pieces2._3_1_ == 0) {
    files_checked(this);
  }
  else {
    stop_announcing(this);
    set_state(this,checking_files);
    bVar1 = should_check_files(this);
    if (bVar1) {
      start_checking(this);
    }
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])
              ();
  }
  maybe_done_flushing(this);
  ::std::
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>::
  reset(&this->m_add_torrent_params,(pointer)0x0);
  (this->m_need_save_resume_data).m_val = local_21;
  return;
}

Assistant:

void torrent::on_resume_data_checked(status_t const status
		, storage_error const& error) try
	{
#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(m_outstanding_check_files);
		m_outstanding_check_files = false;
#endif

		// when applying some of the resume data to the torrent, we will
		// trigger calls that set m_need_save_resume_data, even though we're
		// just applying the state of the resume data we loaded with. We don't
		// want anything in this function to affect the state of
		// m_need_save_resume_data, so we save it in a local variable and reset
		// it at the end of the function.
		auto const need_save_resume_data = m_need_save_resume_data;

		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;

		if (status & disk_status::oversized_file)
		{
			if (m_ses.alerts().should_post<oversized_file_alert>())
				m_ses.alerts().emplace_alert<oversized_file_alert>(get_handle());
		}

		if (status & disk_status::fatal_disk_error)
		{
			TORRENT_ASSERT(m_outstanding_check_files == false);
			handle_disk_error("check_resume_data", error);
			auto_managed(false);
			pause();
		}

		state_updated();

		if (m_add_torrent_params)
		{
			// --- PEERS ---

			for (auto const& p : m_add_torrent_params->peers)
			{
				add_peer(p , peer_info::resume_data);
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log() && !m_add_torrent_params->peers.empty())
			{
				std::string str;
				for (auto const& peer : m_add_torrent_params->peers)
				{
					str += peer.address().to_string();
					str += ' ';
				}
				debug_log("resume-checked add_peer() [ %s] connect-candidates: %d"
					, str.c_str(), m_peer_list
					? m_peer_list->num_connect_candidates() : -1);
			}
#endif

			for (auto const& p : m_add_torrent_params->banned_peers)
			{
				torrent_peer* peer = add_peer(p, peer_info::resume_data);
				if (peer) ban_peer(peer);
			}

			if (!m_add_torrent_params->peers.empty()
				|| !m_add_torrent_params->banned_peers.empty())
			{
				update_want_peers();
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (m_peer_list && m_peer_list->num_peers() > 0)
				debug_log("resume added peers (total peers: %d)"
					, m_peer_list->num_peers());
#endif
		}

		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::need_full_check)
			|| (status & disk_status::file_exist);

		// only report this error if the user actually provided resume data
		// (i.e. m_add_torrent_params->have_pieces)
		if ((error || has_error_status)
			&& m_add_torrent_params
			&& aux::contains_resume_data(*m_add_torrent_params)
			&& m_ses.alerts().should_post<fastresume_rejected_alert>())
		{
			m_ses.alerts().emplace_alert<fastresume_rejected_alert>(get_handle()
				, error.ec
				, resolve_filename(error.file())
				, error.operation);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			if (has_error_status || error)
			{
				debug_log("fastresume data rejected: ret: %d (%d) op: %s file: %d %s"
					, int(static_cast<std::uint8_t>(status)), error.ec.value()
					, operation_name(error.operation)
					, static_cast<int>(error.file())
					, error.ec.message().c_str());
			}
			else
			{
				debug_log("fastresume data accepted");
			}
		}
#endif

		bool should_start_full_check = has_error_status;

		// if we got a partial pieces bitfield, it means we were in the middle of
		// checking this torrent. pick it up where we left off
		if (!has_error_status
			&& m_add_torrent_params
			&& !m_add_torrent_params->have_pieces.empty()
			&& m_add_torrent_params->have_pieces.size() < m_torrent_file->num_pieces())
		{
			m_checking_piece = m_num_checked_pieces
				= m_add_torrent_params->have_pieces.end_index();
			should_start_full_check = true;
		}

		// if ret != 0, it means we need a full check. We don't necessarily need
		// that when the resume data check fails. For instance, if the resume data
		// is incorrect, but we don't have any files, we skip the check and initialize
		// the storage to not have anything.
		if (!has_error_status)
		{
			// there are either no files for this torrent
			// or the resume_data was accepted

			if (m_seed_mode)
			{
				m_have_all = true;
				update_gauge();
				update_state_list();

				if (!error && m_add_torrent_params)
				{
					int const num_pieces2 = std::min(m_add_torrent_params->verified_pieces.size()
						, torrent_file().num_pieces());
					for (piece_index_t i{0}; i < piece_index_t(num_pieces2); ++i)
					{
						if (!m_add_torrent_params->verified_pieces[i]) continue;
						m_verified.set_bit(i);
					}
				}
			}
			else if (!error && m_add_torrent_params)
			{
				// --- PIECES ---

				int const num_pieces = std::min(m_add_torrent_params->have_pieces.size()
					, torrent_file().num_pieces());
				for (piece_index_t i{0}; i < piece_index_t(num_pieces); ++i)
				{
					if (!m_add_torrent_params->have_pieces[i]) continue;
					need_picker();
					m_picker->we_have(i);
					inc_stats_counter(counters::num_piece_passed);
					update_gauge();
					we_have(i, true);
				}

				// --- UNFINISHED PIECES ---

				int const num_blocks_per_piece = torrent_file().blocks_per_piece();

				for (auto const& p : m_add_torrent_params->unfinished_pieces)
				{
					piece_index_t const piece = p.first;
					bitfield const& blocks = p.second;

					if (piece < piece_index_t(0) || piece >= torrent_file().end_piece())
					{
						continue;
					}

					// being in seed mode and missing a piece is not compatible.
					// Leave seed mode if that happens
					if (m_seed_mode) leave_seed_mode(seed_mode_t::skip_checking);

					if (has_picker() && m_picker->have_piece(piece))
					{
						m_picker->we_dont_have(piece);
						update_gauge();
					}

					need_picker();

					const int num_bits = std::min(num_blocks_per_piece, int(blocks.size()));
					for (int k = 0; k < num_bits; ++k)
					{
						if (blocks.get_bit(k))
						{
							m_picker->mark_as_finished(piece_block(piece, k), nullptr);
						}
					}
					if (m_picker->is_piece_finished(piece))
					{
						verify_piece(piece);
					}
				}
			}
		}
		else
		{
			m_seed_mode = false;
			// either the fastresume data was rejected or there are
			// some files
			m_have_all = false;
			update_gauge();
			update_state_list();
		}

		if (should_start_full_check)
		{
			stop_announcing();
			set_state(torrent_status::checking_files);
			if (should_check_files()) start_checking();

			// start the checking right away (potentially)
			m_ses.trigger_auto_manage();
		}
		else
		{
			files_checked();
		}

		// this will remove the piece picker, if we're done with it
		maybe_done_flushing();
		TORRENT_ASSERT(m_outstanding_check_files == false);
		m_add_torrent_params.reset();

		// restore m_need_save_resume_data to its state when we entered this
		// function.
		m_need_save_resume_data = need_save_resume_data;
	}
	catch (...) { handle_exception(); }